

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::grisu2_prettify<fmt::v5::internal::char_counter&>
               (gen_digits_params *params,int size,int exp,char_counter *handler)

{
  int iVar1;
  int iVar2;
  fill fVar3;
  char_counter *in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  ptrdiff_t num_zeros_1;
  int num_zeros;
  int exp_threshold;
  int full_exp;
  undefined2 in_stack_ffffffffffffffc4;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    char_counter::insert(in_RCX,1,'.');
    if (in_ESI < *in_RDI) {
      char_counter::append(in_RCX,(long)(*in_RDI - in_ESI),'0');
    }
    iVar2 = CONCAT13(0x45,CONCAT12(0x65,in_stack_ffffffffffffffc4));
    if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
      iVar2 = CONCAT13(0x65,CONCAT12(0x65,in_stack_ffffffffffffffc4));
    }
    char_counter::append(in_RCX,(char)((uint)iVar2 >> 0x18));
    write_exponent<fmt::v5::internal::char_counter&>(iVar2,in_RCX);
  }
  else {
    iVar2 = in_ESI + in_EDX;
    if ((iVar2 < in_ESI) || (0x15 < iVar2)) {
      if (iVar2 < 1) {
        fVar3.n._0_4_ = to_unsigned<int>(-iVar2);
        fVar3.n._4_4_ = 0;
        char_counter::insert<fmt::v5::internal::fill>(in_RCX,0,(long)(2 - iVar2),fVar3);
      }
      else {
        char_counter::insert(in_RCX,(long)iVar2,'.');
        if ((*(byte *)((long)in_RDI + 6) & 1) == 0) {
          char_counter::remove_trailing(in_RCX,'0');
        }
        else if (in_ESI < *in_RDI) {
          char_counter::append(in_RCX,(long)(*in_RDI - in_ESI),'0');
        }
      }
    }
    else {
      char_counter::append(in_RCX,(long)(iVar2 - in_ESI),'0');
      iVar1 = *in_RDI;
      if ((0 < iVar1 - iVar2) && ((*(byte *)((long)in_RDI + 6) & 1) != 0)) {
        char_counter::append(in_RCX,'.');
        char_counter::append(in_RCX,(long)(iVar1 - iVar2),'0');
      }
    }
  }
  return;
}

Assistant:

FMT_FUNC void grisu2_prettify(const gen_digits_params &params,
                              int size, int exp, Handler &&handler) {
  if (!params.fixed) {
    // Insert a decimal point after the first digit and add an exponent.
    handler.insert(1, '.');
    exp += size - 1;
    if (size < params.num_digits)
      handler.append(params.num_digits - size, '0');
    handler.append(params.upper ? 'E' : 'e');
    write_exponent(exp, handler);
    return;
  }
  // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
  int full_exp = size + exp;
  const int exp_threshold = 21;
  if (size <= full_exp && full_exp <= exp_threshold) {
    // 1234e7 -> 12340000000[.0+]
    handler.append(full_exp - size, '0');
    int num_zeros = params.num_digits - full_exp;
    if (num_zeros > 0 && params.trailing_zeros) {
      handler.append('.');
      handler.append(num_zeros, '0');
    }
  } else if (full_exp > 0) {
    // 1234e-2 -> 12.34[0+]
    handler.insert(full_exp, '.');
    if (!params.trailing_zeros) {
      // Remove trailing zeros.
      handler.remove_trailing('0');
    } else if (params.num_digits > size) {
      // Add trailing zeros.
      ptrdiff_t num_zeros = params.num_digits - size;
      handler.append(num_zeros, '0');
    }
  } else {
    // 1234e-6 -> 0.001234
    handler.insert(0, 2 - full_exp, fill{to_unsigned(-full_exp)});
  }
}